

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::printer_internal2::DefaultPrintNonContainerTo<iutest::detail::iuStreamMessage>
               (iuStreamMessage *value,iu_ostream *os)

{
  iu_ostream *os_local;
  iuStreamMessage *value_local;
  
  detail::operator<<(os,value);
  return;
}

Assistant:

void DefaultPrintNonContainerTo(const T& value, iu_ostream* os)
{
    using namespace ::iutest::detail::printer_internal; // NOLINT
    *os << value;
}